

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH8Factory::BVH8QuantizedQuad4i(BVH8Factory *this,Scene *scene)

{
  bool bVar1;
  BVHN<8> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors intersectors;
  
  this_00 = (BVHN<8> *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN(this_00,(PrimitiveType *)&QuadMi<4>::type,scene);
  intersectors.collider.name = (char *)0x0;
  intersectors.intersector1.intersect = (IntersectFunc)0x0;
  intersectors.leafIntersector = (void *)0x0;
  intersectors.collider.collide = (CollideFunc)0x0;
  intersectors.intersector1.occluded = (OccludedFunc)0x0;
  memset(&intersectors.intersector1.name,0,0xe0);
  intersectors.ptr = (AccelData *)this_00;
  (*this->QBVH8Quad4iIntersector1Pluecker)(&intersectors.intersector1);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0xf0),"default");
  if (bVar1) {
    builder = (*this->BVH8QuantizedQuad4iSceneBuilderSAH)(this_00,scene,0);
    this_01 = (AccelInstance *)Accel::operator_new(0x180);
    AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&intersectors);
    return &this_01->super_Accel;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::operator+(&local_180,"unknown builder ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
  std::operator+(&local_160,&local_180," for QBVH8<Quad4i>");
  *puVar2 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar2 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_160);
  __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

Accel* BVH8Factory::BVH8QuantizedQuad4i(Scene* scene)
  {
    BVH8* accel = new BVH8(Quad4i::type,scene);
    Accel::Intersectors intersectors = QBVH8Quad4iIntersectors(accel);
    Builder* builder = nullptr;
    if      (scene->device->quad_builder == "default"     ) builder = BVH8QuantizedQuad4iSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->quad_builder+" for QBVH8<Quad4i>");
    return new AccelInstance(accel,builder,intersectors);
  }